

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ggml-backend.cpp
# Opt level: O3

void ggml_backend_multi_buffer_clear(ggml_backend_buffer_t buffer,uint8_t value)

{
  long *plVar1;
  long lVar2;
  ulong uVar3;
  ulong uVar4;
  
  plVar1 = (long *)buffer->context;
  uVar3 = plVar1[1];
  if (uVar3 != 0) {
    uVar4 = 0;
    do {
      lVar2 = *(long *)(*plVar1 + uVar4 * 8);
      if (*(long *)(lVar2 + 0x58) != 0) {
        (**(code **)(lVar2 + 0x38))(lVar2,value);
        uVar3 = plVar1[1];
      }
      uVar4 = uVar4 + 1;
    } while (uVar4 < uVar3);
  }
  return;
}

Assistant:

static void ggml_backend_multi_buffer_clear(ggml_backend_buffer_t buffer, uint8_t value) {
    ggml_backend_multi_buffer_context * ctx = (ggml_backend_multi_buffer_context *) buffer->context;
    for (size_t i = 0; i < ctx->n_buffers; i++) {
        ggml_backend_buffer_clear(ctx->buffers[i], value);
    }
}